

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O2

void test_bson_utf8_invalid(void)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  cVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,1);
  if (cVar1 == '\0') {
    cVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,0);
    if (cVar1 == '\0') {
      lVar2 = bson_utf8_escape_for_json(test_bson_utf8_invalid::bad,1);
      if (lVar2 == 0) {
        return;
      }
      pcVar3 = "!bson_utf8_escape_for_json ((const char *) bad, 1)";
      uStack_10 = 0x51;
    }
    else {
      pcVar3 = "!bson_utf8_validate ((const char *) bad, 1, false)";
      uStack_10 = 0x50;
    }
  }
  else {
    pcVar3 = "!bson_utf8_validate ((const char *) bad, 1, true)";
    uStack_10 = 0x4f;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
          uStack_10,"test_bson_utf8_invalid",pcVar3);
  abort();
}

Assistant:

static void
test_bson_utf8_invalid (void)
{
   /* no UTF-8 sequence can start with 0x80 */
   static const unsigned char bad[] = {0x80, 0};

   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, true));
   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, false));
   BSON_ASSERT (!bson_utf8_escape_for_json ((const char *) bad, 1));
}